

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall
SslUdpSocketImpl::CreateServerSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  pointer pSVar1;
  SslUdpSocketImpl *local_88;
  offset_in_BaseSocketImpl_to_subr local_80 [2];
  type local_70;
  function<void_()> local_58;
  undefined1 local_38 [23];
  bool bRet;
  char *szIpToBind_local;
  undefined1 auStack_18 [6];
  uint16_t sPort_local;
  char *szIpToWhere_local;
  SslUdpSocketImpl *this_local;
  
  unique0x10000124 = szIpToBind;
  szIpToBind_local._6_2_ = sPort;
  _auStack_18 = szIpToWhere;
  szIpToWhere_local = (char *)this;
  local_38[0xf] = UdpSocketImpl::Create(&this->super_UdpSocketImpl,szIpToWhere,sPort,szIpToBind);
  if ((bool)local_38[0xf]) {
    std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslUdpContext&>
              ((SslUdpContext *)local_38);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    operator=(&this->m_pSslCon,
              (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_38);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)local_38);
    pSVar1 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    local_80[1] = 0;
    local_80[0] = 0x11;
    local_88 = this;
    std::bind<void(BaseSocketImpl::*)(),SslUdpSocketImpl*>(&local_70,local_80,&local_88);
    std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslUdpSocketImpl*))()>,void>
              ((function<void()> *)&local_58,&local_70);
    OpenSSLWrapper::SslConnection::SetErrorCb(pSVar1,&local_58);
    std::function<void_()>::~function(&local_58);
    pSVar1 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SSLSetAcceptState(pSVar1);
  }
  return (bool)(local_38[0xf] & 1);
}

Assistant:

bool SslUdpSocketImpl::CreateServerSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackServer);

        m_pSslCon->SSLSetAcceptState();
    }
    return bRet;
}